

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::ReadInternal<true>
          (DeltaLengthByteArrayDecoder *this,shared_ptr<duckdb::ResizeableBuffer,_true> *block_ref,
          uint8_t *defines,idx_t read_count,Vector *result,idx_t result_offset)

{
  uint64_t *puVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  data_ptr_t __src;
  type pRVar5;
  StringColumnReader *this_00;
  IOException *this_01;
  undefined8 *puVar6;
  bool bVar7;
  allocator local_89;
  type local_88;
  data_ptr_t local_80;
  string local_78;
  data_ptr_t local_58;
  shared_ptr<duckdb::ResizeableBuffer,_true> *local_50;
  Vector *local_48;
  TemplatedValidityMask<unsigned_long> *local_40;
  uint8_t *local_38;
  
  local_50 = block_ref;
  local_38 = defines;
  pRVar5 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(block_ref);
  local_80 = (this->length_buffer->super_ByteBuffer).ptr;
  lVar3 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  local_40 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
  local_58 = (pRVar5->super_ByteBuffer).ptr;
  puVar6 = (undefined8 *)(result_offset * 0x10 + lVar3 + 4);
  local_88 = pRVar5;
  local_48 = result;
  do {
    bVar7 = read_count == 0;
    read_count = read_count - 1;
    if (bVar7) {
      this_00 = ColumnReader::Cast<duckdb::StringColumnReader>(this->reader);
      StringColumnReader::VerifyString
                (this_00,(char *)local_58,*(int *)&(local_88->super_ByteBuffer).ptr - (int)local_58)
      ;
      StringColumnReader::ReferenceBlock(local_48,local_50);
      return;
    }
    if (this->reader->column_schema->max_define == (ulong)local_38[result_offset]) {
      uVar4 = this->length_idx;
      if (this->byte_array_count <= uVar4) {
        this_01 = (IOException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_78,
                   "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted read of %d from %d entries) - corrupt file?"
                   ,&local_89);
        IOException::IOException<unsigned_long,unsigned_long>
                  (this_01,&local_78,this->length_idx,this->byte_array_count);
        __cxa_throw(this_01,&IOException::typeinfo,std::runtime_error::~runtime_error);
      }
      this->length_idx = uVar4 + 1;
      __src = (local_88->super_ByteBuffer).ptr;
      uVar2 = *(uint *)(local_80 + uVar4 * 4);
      if ((ulong)uVar2 < 0xd) {
        local_78._M_string_length._0_4_ = 0;
        local_78._M_dataplus._M_p._0_4_ = 0;
        local_78._M_dataplus._M_p._4_4_ = 0;
        if (uVar2 != 0) {
          switchD_0036ec8a::default(&local_78,__src,(ulong)uVar2);
        }
      }
      else {
        local_78._M_dataplus._M_p._0_4_ = *(undefined4 *)__src;
        local_78._M_dataplus._M_p._4_4_ = SUB84(__src,0);
        local_78._M_string_length._0_4_ = (undefined4)((ulong)__src >> 0x20);
      }
      *(uint *)((long)puVar6 + -4) = uVar2;
      *puVar6 = CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_);
      *(undefined4 *)(puVar6 + 1) = (undefined4)local_78._M_string_length;
      uVar2 = *(uint *)(local_80 + uVar4 * 4);
      puVar1 = &(local_88->super_ByteBuffer).len;
      *puVar1 = *puVar1 - (ulong)uVar2;
      (local_88->super_ByteBuffer).ptr = (local_88->super_ByteBuffer).ptr + uVar2;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid(local_40,result_offset);
    }
    result_offset = result_offset + 1;
    puVar6 = puVar6 + 2;
  } while( true );
}

Assistant:

void DeltaLengthByteArrayDecoder::ReadInternal(shared_ptr<ResizeableBuffer> &block_ref, uint8_t *const defines,
                                               const idx_t read_count, Vector &result, const idx_t result_offset) {
	auto &block = *block_ref;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);
	auto result_data = FlatVector::GetData<string_t>(result);
	auto &result_mask = FlatVector::Validity(result);

	if (!HAS_DEFINES) {
		// Fast path: take this out of the loop below
		if (length_idx + read_count > byte_array_count) {
			throw IOException(
			    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
			    "read of %d from %d entries) - corrupt file?",
			    length_idx + read_count, byte_array_count);
		}
	}

	const auto start_ptr = block.ptr;
	for (idx_t row_idx = 0; row_idx < read_count; row_idx++) {
		const auto result_idx = result_offset + row_idx;
		if (HAS_DEFINES) {
			if (defines[result_idx] != reader.MaxDefine()) {
				result_mask.SetInvalid(result_idx);
				continue;
			}
			if (length_idx >= byte_array_count) {
				throw IOException(
				    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
				    "read of %d from %d entries) - corrupt file?",
				    length_idx, byte_array_count);
			}
		}
		const auto &str_len = length_data[length_idx++];
		result_data[result_idx] = string_t(char_ptr_cast(block.ptr), str_len);
		block.unsafe_inc(str_len);
	}

	// Verify that the strings we read are valid UTF-8
	reader.Cast<StringColumnReader>().VerifyString(char_ptr_cast(start_ptr), block.ptr - start_ptr);

	StringColumnReader::ReferenceBlock(result, block_ref);
}